

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall CCNR::ls_solver::clear_prev_data(ls_solver *this)

{
  bool bVar1;
  reference piVar2;
  vector<int,_std::allocator<int>_> *in_RDI;
  int *item_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int *item;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff70;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  pointer *local_58;
  undefined1 local_50 [24];
  undefined1 local_38 [24];
  undefined1 local_20 [32];
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x165ba4);
  memset(local_20,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x165bbf);
  std::vector<int,_std::allocator<int>_>::swap
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current,
             in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x165beb);
  memset(local_38,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x165c06);
  std::vector<int,_std::allocator<int>_>::swap
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current,
             in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x165c35);
  memset(local_50,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x165c50);
  std::vector<int,_std::allocator<int>_>::swap
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current,
             in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80._M_current);
  local_58 = &in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_60._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  std::vector<int,_std::allocator<int>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_60);
    *piVar2 = 0;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_60);
  }
  std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  std::vector<int,_std::allocator<int>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffff70 =
         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
         __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                    &stack0xffffffffffffff80);
    *(int *)&in_stack_ffffffffffffff70->_M_current = 0;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffff80);
  }
  return;
}

Assistant:

void ls_solver::clear_prev_data()
{
    _unsat_clauses.clear();
    vector<int>().swap(_unsat_clauses);
    _ccd_vars.clear();
    vector<int>().swap(_ccd_vars);
    _unsat_vars.clear();
    vector<int>().swap(_unsat_vars);
    for (int &item : _index_in_unsat_clauses) item = 0;
    for (int &item : _index_in_unsat_vars) item = 0;
}